

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeries.cpp
# Opt level: O3

void __thiscall
OpenMD::InversePowerSeries::addExplicitInteraction
          (InversePowerSeries *this,AtomType *atype1,AtomType *atype2,
          vector<int,_std::allocator<int>_> *powers,
          vector<double,_std::allocator<double>_> *coefficients)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  size_type __new_size;
  vector<int,_std::allocator<int>_> *pvVar5;
  vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
  *this_00;
  InversePowerSeriesInteractionData mixer;
  vector<int,_std::allocator<int>_> local_68;
  vector<double,_std::allocator<double>_> vStack_50;
  
  vStack_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::operator=(&local_68,powers);
  std::vector<double,_std::allocator<double>_>::operator=(&vStack_50,coefficients);
  iVar1 = AtomType::getIdent(atype1);
  iVar1 = (this->InversePowerSeriesTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1];
  lVar3 = (long)iVar1;
  iVar2 = AtomType::getIdent(atype2);
  iVar2 = (this->InversePowerSeriesTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2];
  lVar4 = (long)iVar2;
  __new_size = (size_type)
               (int)(this->InversePowerSeriesTypes)._M_t._M_impl.super__Rb_tree_header._M_node_count
  ;
  this_00 = &this->MixingMap;
  std::
  vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
  ::resize(this_00,__new_size);
  std::
  vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>
  ::resize((this_00->
           super__Vector_base<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + lVar3,__new_size);
  pvVar5 = (vector<int,_std::allocator<int>_> *)
           (lVar4 * 0x30 +
           *(long *)&(this_00->
                     super__Vector_base<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar3].
                     super__Vector_base<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>
                     ._M_impl.super__Vector_impl_data);
  std::vector<int,_std::allocator<int>_>::operator=(pvVar5,&local_68);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)(pvVar5 + 1),&vStack_50);
  if (iVar2 != iVar1) {
    std::
    vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>
    ::resize((this_00->
             super__Vector_base<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + lVar4,__new_size);
    pvVar5 = (vector<int,_std::allocator<int>_> *)
             (lVar3 * 0x30 +
             *(long *)&(this_00->
                       super__Vector_base<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[lVar4].
                       super__Vector_base<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>
                       ._M_impl.super__Vector_impl_data);
    std::vector<int,_std::allocator<int>_>::operator=(pvVar5,&local_68);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)(pvVar5 + 1),&vStack_50);
  }
  if (vStack_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vStack_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void InversePowerSeries::addExplicitInteraction(
      AtomType* atype1, AtomType* atype2, std::vector<int> powers,
      std::vector<RealType> coefficients) {
    InversePowerSeriesInteractionData mixer;
    mixer.powers       = powers;
    mixer.coefficients = coefficients;

    int ipstid1             = InversePowerSeriesTids[atype1->getIdent()];
    int ipstid2             = InversePowerSeriesTids[atype2->getIdent()];
    int nInversePowerSeries = InversePowerSeriesTypes.size();

    MixingMap.resize(nInversePowerSeries);
    MixingMap[ipstid1].resize(nInversePowerSeries);

    MixingMap[ipstid1][ipstid2] = mixer;
    if (ipstid2 != ipstid1) {
      MixingMap[ipstid2].resize(nInversePowerSeries);
      MixingMap[ipstid2][ipstid1] = mixer;
    }
  }